

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Id __thiscall
dxil_spv::Converter::Impl::create_bindless_heap_variable(Impl *this,BindlessInfo *info)

{
  pointer *ppBVar1;
  ResourceKind RVar2;
  RawType RVar3;
  RawVecSize RVar4;
  BindlessResource *pBVar5;
  pointer ptr;
  iterator __position;
  bool bVar6;
  ComponentType CVar7;
  Id IVar8;
  uint uVar9;
  Id IVar10;
  Dim dim;
  Builder *pBVar11;
  Builder *this_00;
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  *this_01;
  mapped_type *pmVar12;
  LoggingCallback p_Var13;
  void *pvVar14;
  byte bVar15;
  uint uVar16;
  StorageClass storage;
  Decoration decoration;
  long lVar17;
  uint range_size;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  _Var18;
  bool ms;
  uint vecsize;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  __it;
  __normal_iterator<dxil_spv::Converter::Impl::BindlessResource_*,_std::vector<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>_>
  __it_00;
  ImageFormat format;
  BindlessResource local_1068;
  Builder *local_1040;
  char buffer [4096];
  
  __it._M_current =
       (this->bindless_resources).
       super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pBVar5 = (this->bindless_resources).
           super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar17 = ((long)pBVar5 - (long)__it._M_current >> 3) * -0x3333333333333333 >> 2;
  __it_00._M_current = __it._M_current;
  buffer._0_8_ = info;
  if (0 < lVar17) {
    __it_00._M_current = __it._M_current + lVar17 * 4;
    lVar17 = lVar17 + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                            *)buffer,__it);
      _Var18._M_current = __it._M_current;
      if (bVar6) goto LAB_00112684;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                            *)buffer,__it._M_current + 1);
      _Var18._M_current = __it._M_current + 1;
      if (bVar6) goto LAB_00112684;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                            *)buffer,__it._M_current + 2);
      _Var18._M_current = __it._M_current + 2;
      if (bVar6) goto LAB_00112684;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
              ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                            *)buffer,__it._M_current + 3);
      _Var18._M_current = __it._M_current + 3;
      if (bVar6) goto LAB_00112684;
      __it._M_current = __it._M_current + 4;
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
  }
  lVar17 = ((long)pBVar5 - (long)__it_00._M_current >> 3) * -0x3333333333333333;
  if (lVar17 == 1) {
LAB_0011265f:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                          *)buffer,__it_00);
    _Var18._M_current = __it_00._M_current;
    if (!bVar6) {
      _Var18._M_current = pBVar5;
    }
  }
  else if (lVar17 == 2) {
LAB_0011264a:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                          *)buffer,__it_00);
    _Var18._M_current = __it_00._M_current;
    if (!bVar6) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0011265f;
    }
  }
  else {
    _Var18._M_current = pBVar5;
    if ((lVar17 == 3) &&
       (bVar6 = __gnu_cxx::__ops::
                _Iter_pred<dxil_spv::Converter::Impl::create_bindless_heap_variable(dxil_spv::Converter::Impl::BindlessInfo_const&)::$_0>
                ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_HansKristian_Work[P]dxil_spirv_dxil_converter_cpp:425:80)>
                              *)buffer,__it_00), _Var18._M_current = __it_00._M_current, !bVar6)) {
      __it_00._M_current = __it_00._M_current + 1;
      goto LAB_0011264a;
    }
  }
LAB_00112684:
  if (_Var18._M_current != pBVar5) {
    return (_Var18._M_current)->var_id;
  }
  local_1068.var_id = 0;
  local_1068.info.binding = info->binding;
  local_1068.info.type = info->type;
  local_1068.info.component = info->component;
  local_1068.info._2_2_ = *(undefined2 *)&info->field_0x2;
  local_1068.info.raw_vecsize = info->raw_vecsize;
  local_1068.info.kind = info->kind;
  local_1068.info._9_3_ = *(undefined3 *)&info->field_0x9;
  local_1068.info.format = info->format;
  local_1068.info.descriptor_type = info->descriptor_type;
  local_1068.info.uav_read = info->uav_read;
  local_1068.info.uav_written = info->uav_written;
  local_1068.info.uav_coherent = info->uav_coherent;
  local_1068.info.counters = info->counters;
  local_1068.info.offsets = info->offsets;
  local_1068.info.aliased = info->aliased;
  local_1068.info.relaxed_precision = info->relaxed_precision;
  local_1068.info._27_1_ = info->field_0x1b;
  local_1068.info.desc_set = info->desc_set;
  IVar8 = 0;
  switch(info->type) {
  case SRV:
    if (info->kind == RTAccelerationStructure) {
      if (info->descriptor_type != SSBO) {
        pBVar11 = SPIRVModule::get_builder(this->spirv_module);
        IVar8 = spv::Builder::makeAccelerationStructureType(pBVar11);
        goto LAB_001127db;
      }
      buffer._0_8_ = buffer + 0x10;
      std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
                 buffer,"RTASHeap","");
      IVar8 = build_ssbo_runtime_array_type(this,Integer,0x20,2,1,(String *)buffer);
      if ((char *)buffer._0_8_ != buffer + 0x10) {
        free_in_thread((void *)buffer._0_8_);
      }
      storage = StorageClassStorageBuffer;
    }
    else {
      CVar7 = info->component;
      if (info->descriptor_type == SSBO) {
        uVar9 = CVar7 + 1;
        if ((0xb < (byte)uVar9) || ((0xf51U >> (uVar9 & 0x1f) & 1) == 0)) goto LAB_001132a1;
        bVar15 = CVar7 + I1;
        if ((0xb < bVar15) || ((0xf51U >> (bVar15 & 0x1f) & 1) == 0)) goto LAB_001132c0;
        RVar3 = *(RawType *)(&DAT_001c2584 + (ulong)(uVar9 & 0xff) * 4);
        uVar9 = *(uint *)(&DAT_001c25b4 + (ulong)bVar15 * 4);
        if (info->offsets == true) {
          buffer._0_8_ = buffer + 0x10;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                      *)buffer,"SSBO_Offsets","");
          vecsize = 2;
          range_size = 1;
          uVar16 = 0x20;
        }
        else {
          vecsize = info->raw_vecsize + V2;
          buffer._0_8_ = buffer + 0x10;
          std::__cxx11::
          basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                      *)buffer,"SSBO","");
          range_size = 0xffffffff;
          uVar16 = uVar9;
        }
        IVar8 = build_ssbo_runtime_array_type(this,RVar3,uVar16,vecsize,range_size,(String *)buffer)
        ;
        if ((char *)buffer._0_8_ != buffer + 0x10) {
          free_in_thread((void *)buffer._0_8_);
        }
        if (uVar9 == 8) {
          pBVar11 = SPIRVModule::get_builder(this->spirv_module);
          spv::Builder::addExtension(pBVar11,"SPV_KHR_8bit_storage");
          pBVar11 = SPIRVModule::get_builder(this->spirv_module);
          buffer[0] = '`';
          buffer[1] = '\x11';
          buffer[2] = '\0';
          buffer[3] = '\0';
        }
        else {
          if (uVar9 != 0x10) goto LAB_00112f94;
          pBVar11 = SPIRVModule::get_builder(this->spirv_module);
          buffer[0] = 'Q';
          buffer[1] = '\x11';
          buffer[2] = '\0';
          buffer[3] = '\0';
        }
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar11->capabilities,(Capability *)buffer);
        goto LAB_00112f94;
      }
      if ((9 < CVar7) || ((0x230U >> (CVar7 & 0x1f) & 1) == 0)) {
        p_Var13 = get_thread_log_callback();
        if (p_Var13 == (LoggingCallback)0x0) {
          create_bindless_heap_variable();
          return 0;
        }
LAB_0011325f:
        builtin_strncpy(buffer,"Invalid component type for image.\n",0x23);
        pvVar14 = get_thread_log_callback_userdata();
        (*p_Var13)(pvVar14,Error,buffer);
        return 0;
      }
      IVar8 = get_type_id(this,CVar7,1,1,false);
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      RVar2 = info->kind;
      dim = image_dimension_from_resource_kind(RVar2);
      bVar6 = (bool)((byte)(0x403c0 >> (RVar2 & (RTAccelerationStructure|TBuffer))) &
                    RVar2 < (FeedbackTexture2DArray|Texture1D));
      ms = RVar2 == Texture2DMS || RVar2 == Texture2DMSArray;
      format = ImageFormatUnknown;
      uVar9 = 1;
LAB_00112e55:
      storage = StorageClassUniformConstant;
      IVar8 = spv::Builder::makeImageType(pBVar11,IVar8,dim,false,bVar6,ms,uVar9,format);
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeRuntimeArray(pBVar11,IVar8);
    }
    break;
  case UAV:
    if (info->counters == true) {
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeIntegerType(pBVar11,0x20,false);
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeVectorType(pBVar11,IVar8,2);
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeRuntimeArray(pBVar11,IVar8);
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar11,IVar8,DecorationArrayStride,8);
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      buffer._0_8_ = allocate_in_thread(4);
      buffer._8_8_ = buffer._0_8_ + 4;
      *(Id *)buffer._0_8_ = IVar8;
      buffer._16_8_ = buffer._8_8_;
      IVar8 = get_struct_type(this,(Vector<spv::Id> *)buffer,0,"AtomicCounters");
      if (buffer._0_8_ != 0) {
        free_in_thread((void *)buffer._0_8_);
      }
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar11,IVar8,DecorationBlock,-1);
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberName(pBVar11,IVar8,0,"counters");
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar11,IVar8,0,DecorationOffset,0);
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar11,IVar8,0,DecorationNonWritable,-1);
LAB_00112f94:
      storage = StorageClassStorageBuffer;
    }
    else {
      CVar7 = info->component;
      if (info->descriptor_type != SSBO) {
        if ((9 < CVar7) || ((0x2b0U >> (CVar7 & 0x1f) & 1) == 0)) {
          p_Var13 = get_thread_log_callback();
          if (p_Var13 == (LoggingCallback)0x0) {
            create_bindless_heap_variable();
            return 0;
          }
          goto LAB_0011325f;
        }
        IVar8 = get_type_id(this,CVar7,1,1,false);
        local_1040 = SPIRVModule::get_builder(this->spirv_module);
        RVar2 = info->kind;
        dim = image_dimension_from_resource_kind(RVar2);
        bVar6 = (bool)((byte)(0x403c0 >> (RVar2 & (RTAccelerationStructure|TBuffer))) &
                      RVar2 < (FeedbackTexture2DArray|Texture1D));
        ms = RVar2 == Texture2DMS || RVar2 == Texture2DMSArray;
        format = info->format;
        uVar9 = 2;
        pBVar11 = local_1040;
        goto LAB_00112e55;
      }
      uVar9 = CVar7 + 1;
      if ((0xb < (byte)uVar9) || ((0xf51U >> (uVar9 & 0x1f) & 1) == 0)) goto LAB_001132a1;
      bVar15 = CVar7 + I1;
      if ((0xb < bVar15) || ((0xf51U >> (bVar15 & 0x1f) & 1) == 0)) goto LAB_001132c0;
      RVar3 = *(RawType *)(&DAT_001c2584 + (ulong)(uVar9 & 0xff) * 4);
      uVar9 = *(uint *)(&DAT_001c25b4 + (ulong)bVar15 * 4);
      RVar4 = info->raw_vecsize;
      buffer._0_8_ = buffer + 0x10;
      std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
                 buffer,"SSBO","");
      IVar8 = build_ssbo_runtime_array_type(this,RVar3,uVar9,RVar4 + V2,0xffffffff,(String *)buffer)
      ;
      if ((char *)buffer._0_8_ != buffer + 0x10) {
        free_in_thread((void *)buffer._0_8_);
      }
      storage = StorageClassStorageBuffer;
      if (uVar9 == 8) {
        pBVar11 = SPIRVModule::get_builder(this->spirv_module);
        spv::Builder::addExtension(pBVar11,"SPV_KHR_8bit_storage");
        pBVar11 = SPIRVModule::get_builder(this->spirv_module);
        buffer[0] = '`';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      else {
        if (uVar9 != 0x10) break;
        pBVar11 = SPIRVModule::get_builder(this->spirv_module);
        buffer[0] = 'Q';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar11->capabilities,(Capability *)buffer);
    }
    break;
  case CBV:
    bVar15 = info->component + I1;
    if (0xb < bVar15) {
LAB_001132a1:
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x8d,"RawType dxil_spv::raw_component_type_to_type(DXIL::ComponentType)");
    }
    if ((0xf51U >> (bVar15 & 0x1f) & 1) == 0) goto LAB_001132a1;
    if ((0xb < bVar15) || ((0xf51U >> (bVar15 & 0x1f) & 1) == 0)) {
LAB_001132c0:
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    }
    uVar9 = *(uint *)(&DAT_001c25b4 + (ulong)bVar15 * 4);
    uVar16 = info->raw_vecsize + V2;
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    if ((0x1ffU >> (bVar15 & 0x1f) & 1) == 0) {
      IVar8 = spv::Builder::makeFloatType(pBVar11,uVar9);
    }
    else {
      IVar8 = spv::Builder::makeIntegerType(pBVar11,uVar9,false);
    }
    if (1 < uVar16) {
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      IVar8 = spv::Builder::makeVectorType(pBVar11,IVar8,uVar16);
    }
    uVar16 = uVar16 * (uVar9 >> 3);
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    this_00 = SPIRVModule::get_builder(this->spirv_module);
    IVar10 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar10 = spv::Builder::makeIntConstant(this_00,IVar10,(uint)(0x10000 / (ulong)uVar16),false);
    IVar8 = spv::Builder::makeArrayType(pBVar11,IVar8,IVar10,uVar16);
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar11,IVar8,DecorationArrayStride,uVar16);
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer._0_8_ = allocate_in_thread(4);
    buffer._8_8_ = buffer._0_8_ + 4;
    *(Id *)buffer._0_8_ = IVar8;
    buffer._16_8_ = buffer._8_8_;
    IVar8 = get_struct_type(this,(Vector<spv::Id> *)buffer,0,"BindlessCBV");
    if (buffer._0_8_ != 0) {
      free_in_thread((void *)buffer._0_8_);
    }
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar11,IVar8,DecorationBlock,-1);
    if ((this->options).bindless_cbv_ssbo_emulation == true) {
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addMemberDecoration(pBVar11,IVar8,0,DecorationNonWritable,-1);
    }
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addMemberDecoration(pBVar11,IVar8,0,DecorationOffset,0);
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    IVar8 = spv::Builder::makeRuntimeArray(pBVar11,IVar8);
    bVar6 = (this->options).bindless_cbv_ssbo_emulation;
    storage = StorageClassUniform;
    if (bVar6 != false) {
      storage = StorageClassStorageBuffer;
    }
    if (uVar9 == 8) {
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addExtension(pBVar11,"SPV_KHR_8bit_storage");
      bVar6 = (this->options).bindless_cbv_ssbo_emulation;
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      this_01 = (_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                 *)&pBVar11->capabilities;
      if (bVar6 == true) {
        buffer[0] = '`';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      else {
        buffer[0] = 'a';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
    }
    else {
      if (uVar9 != 0x10) break;
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      this_01 = (_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                 *)&pBVar11->capabilities;
      if (bVar6 == false) {
        buffer[0] = 'R';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
      else {
        buffer[0] = 'Q';
        buffer[1] = '\x11';
        buffer[2] = '\0';
        buffer[3] = '\0';
      }
    }
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>(this_01,(Capability *)buffer);
    break;
  case Sampler:
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    IVar8 = spv::Builder::makeSamplerType(pBVar11);
LAB_001127db:
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    IVar8 = spv::Builder::makeRuntimeArray(pBVar11,IVar8);
    storage = StorageClassUniformConstant;
    break;
  default:
    goto switchD_001126d7_default;
  }
  pBVar11 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addExtension(pBVar11,"SPV_EXT_descriptor_indexing");
  pBVar11 = SPIRVModule::get_builder(this->spirv_module);
  buffer[0] = -0x4a;
  buffer[1] = '\x14';
  buffer[2] = '\0';
  buffer[3] = '\0';
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar11->capabilities,(Capability *)buffer);
  local_1068.var_id = SPIRVModule::create_variable(this->spirv_module,storage,IVar8,(char *)0x0);
  pmVar12 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->handle_to_resource_meta,&local_1068.var_id);
  pmVar12->kind = Invalid;
  pmVar12->component_type = Invalid;
  pmVar12->raw_component_vecsize = V1;
  pmVar12->stride = 0;
  pmVar12->var_id = 0;
  ptr = (pmVar12->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start;
  (pmVar12->var_alias_group).
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pmVar12->var_alias_group).
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar12->var_alias_group).
  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (ptr != (pointer)0x0) {
    free_in_thread(ptr);
  }
  pmVar12->aliased = false;
  pmVar12->non_uniform = false;
  pmVar12->counter_is_physical_pointer = false;
  pmVar12->rov = false;
  pmVar12->storage = StorageClassUniformConstant;
  pmVar12->counter_var_id = 0;
  (pmVar12->physical_pointer_meta).nonwritable = false;
  (pmVar12->physical_pointer_meta).nonreadable = false;
  (pmVar12->physical_pointer_meta).coherent = false;
  (pmVar12->physical_pointer_meta).rov = false;
  (pmVar12->physical_pointer_meta).stride = '\0';
  *(undefined8 *)&(pmVar12->physical_pointer_meta).size = 0;
  (pmVar12->instrumentation).bda_id = 0;
  (pmVar12->instrumentation).elem_size_id = 0;
  (pmVar12->instrumentation).resource_size_id = 0;
  pmVar12->kind = info->kind;
  pmVar12->component_type = info->component;
  pmVar12->raw_component_vecsize = info->raw_vecsize;
  pmVar12->var_id = local_1068.var_id;
  pmVar12->storage = storage;
  pBVar11 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addDecoration(pBVar11,local_1068.var_id,DecorationDescriptorSet,info->desc_set);
  pBVar11 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addDecoration(pBVar11,local_1068.var_id,DecorationBinding,info->binding);
  if (info->relaxed_precision == true) {
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar11,local_1068.var_id,DecorationRelaxedPrecision,-1);
    CVar7 = pmVar12->component_type;
    if (CVar7 == F32) {
      CVar7 = F16;
    }
    else if (CVar7 == U32) {
      CVar7 = U16;
    }
    else {
      if (CVar7 != I32) goto LAB_001130e4;
      CVar7 = I16;
    }
    pmVar12->component_type = CVar7;
  }
LAB_001130e4:
  if ((info->type == UAV) && (info->counters == false)) {
    if (info->uav_read == false) {
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar11,local_1068.var_id,DecorationNonReadable,-1);
    }
    if (info->uav_written == false) {
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar11,local_1068.var_id,DecorationNonWritable,-1);
    }
    decoration = DecorationCoherent;
    if (info->uav_coherent != false) goto LAB_0011319a;
  }
  else {
    decoration = DecorationAliasedPointer;
    if (info->counters == false) {
      if ((info->type != SRV) || (info->descriptor_type != SSBO)) goto LAB_001131b6;
      pBVar11 = SPIRVModule::get_builder(this->spirv_module);
      spv::Builder::addDecoration(pBVar11,local_1068.var_id,DecorationNonWritable,-1);
      decoration = DecorationRestrict;
    }
LAB_0011319a:
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar11,local_1068.var_id,decoration,-1);
  }
LAB_001131b6:
  if ((info->aliased == true) && (info->type == UAV)) {
    pBVar11 = SPIRVModule::get_builder(this->spirv_module);
    spv::Builder::addDecoration(pBVar11,local_1068.var_id,DecorationAliased,-1);
  }
  __position._M_current =
       (this->bindless_resources).
       super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->bindless_resources).
      super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<dxil_spv::Converter::Impl::BindlessResource,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>>
    ::_M_realloc_insert<dxil_spv::Converter::Impl::BindlessResource_const&>
              ((vector<dxil_spv::Converter::Impl::BindlessResource,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>>
                *)&this->bindless_resources,__position,&local_1068);
    IVar8 = local_1068.var_id;
  }
  else {
    *(ulong *)&((__position._M_current)->info).binding =
         CONCAT44(local_1068.var_id,local_1068.info.binding);
    ((__position._M_current)->info).descriptor_type = local_1068.info.descriptor_type;
    ((__position._M_current)->info).uav_read = (bool)local_1068.info.uav_read;
    ((__position._M_current)->info).uav_written = (bool)local_1068.info.uav_written;
    ((__position._M_current)->info).uav_coherent = (bool)local_1068.info.uav_coherent;
    ((__position._M_current)->info).counters = (bool)local_1068.info.counters;
    ((__position._M_current)->info).offsets = (bool)local_1068.info.offsets;
    ((__position._M_current)->info).aliased = (bool)local_1068.info.aliased;
    ((__position._M_current)->info).relaxed_precision = (bool)local_1068.info.relaxed_precision;
    ((__position._M_current)->info).field_0x1b = local_1068.info._27_1_;
    ((__position._M_current)->info).desc_set = local_1068.info.desc_set;
    ((__position._M_current)->info).type = local_1068.info.type;
    ((__position._M_current)->info).component = local_1068.info.component;
    *(short *)&((__position._M_current)->info).field_0x2 = local_1068.info._2_2_;
    ((__position._M_current)->info).raw_vecsize = local_1068.info.raw_vecsize;
    ((__position._M_current)->info).kind = local_1068.info.kind;
    *(int3 *)&((__position._M_current)->info).field_0x9 = local_1068.info._9_3_;
    ((__position._M_current)->info).format = local_1068.info.format;
    ppBVar1 = &(this->bindless_resources).
               super__Vector_base<dxil_spv::Converter::Impl::BindlessResource,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::BindlessResource>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
    IVar8 = local_1068.var_id;
  }
switchD_001126d7_default:
  return IVar8;
}

Assistant:

spv::Id Converter::Impl::create_bindless_heap_variable(const BindlessInfo &info)
{
	auto itr = std::find_if(bindless_resources.begin(), bindless_resources.end(), [&](const BindlessResource &resource) {
		return
			resource.info.type == info.type &&
			resource.info.component == info.component &&
			resource.info.raw_vecsize == info.raw_vecsize &&
			resource.info.kind == info.kind &&
			resource.info.desc_set == info.desc_set &&
			resource.info.format == info.format &&
			resource.info.binding == info.binding &&
			resource.info.uav_read == info.uav_read &&
			resource.info.uav_written == info.uav_written &&
			resource.info.uav_coherent == info.uav_coherent &&
			resource.info.relaxed_precision == info.relaxed_precision &&
			resource.info.aliased == info.aliased &&
			resource.info.counters == info.counters &&
			resource.info.offsets == info.offsets &&
			resource.info.descriptor_type == info.descriptor_type;
	});

	if (itr != bindless_resources.end())
	{
		return itr->var_id;
	}
	else
	{
		BindlessResource resource = {};
		resource.info = info;

		spv::Id type_id = 0;
		auto storage = spv::StorageClassMax;

		switch (info.type)
		{
		case DXIL::ResourceType::SRV:
		{
			if (info.kind == DXIL::ResourceKind::RTAccelerationStructure)
			{
				if (info.descriptor_type == VulkanDescriptorType::SSBO)
				{
					type_id = build_ssbo_runtime_array_type(*this, RawType::Integer, 32, 2, 1, "RTASHeap");
					storage = spv::StorageClassStorageBuffer;
				}
				else
				{
					type_id = builder().makeAccelerationStructureType();
					type_id = builder().makeRuntimeArray(type_id);
					storage = spv::StorageClassUniformConstant;
				}
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				if (info.offsets)
					type_id = build_ssbo_runtime_array_type(*this, raw_type, 32, 2, 1, "SSBO_Offsets");
				else
					type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
					                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 1, spv::ImageFormatUnknown);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::UAV:
		{
			if (info.counters)
			{
				spv::Id uint_type = builder().makeUintType(32);
				spv::Id uvec2_type = builder().makeVectorType(uint_type, 2);

				spv::Id runtime_array_type_id = builder().makeRuntimeArray(uvec2_type);
				builder().addDecoration(runtime_array_type_id, spv::DecorationArrayStride, sizeof(uint64_t));

				type_id = get_struct_type({ runtime_array_type_id }, 0, "AtomicCounters");
				builder().addDecoration(type_id, spv::DecorationBlock);
				builder().addMemberName(type_id, 0, "counters");
				builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
				storage = spv::StorageClassStorageBuffer;
			}
			else if (info.descriptor_type == VulkanDescriptorType::SSBO)
			{
				RawType raw_type = raw_component_type_to_type(info.component);
				unsigned bits = raw_component_type_to_bits(info.component);

				type_id = build_ssbo_runtime_array_type(*this, raw_type, bits, raw_vecsize_to_vecsize(info.raw_vecsize),
				                                        ~0u, "SSBO");
				storage = spv::StorageClassStorageBuffer;
				if (bits == 16)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else if (bits == 8)
				{
					builder().addExtension("SPV_KHR_8bit_storage");
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				}
			}
			else
			{
				if (info.component != DXIL::ComponentType::U32 &&
				    info.component != DXIL::ComponentType::I32 &&
				    info.component != DXIL::ComponentType::F32 &&
				    info.component != DXIL::ComponentType::U64)
				{
					LOGE("Invalid component type for image.\n");
					return 0;
				}

				spv::Id sampled_type_id = get_type_id(info.component, 1, 1);
				type_id = builder().makeImageType(sampled_type_id, image_dimension_from_resource_kind(info.kind), false,
				                                  image_dimension_is_arrayed(info.kind),
				                                  image_dimension_is_multisampled(info.kind), 2, info.format);
				type_id = builder().makeRuntimeArray(type_id);
				storage = spv::StorageClassUniformConstant;
			}
			break;
		}

		case DXIL::ResourceType::Sampler:
			type_id = builder().makeSamplerType();
			type_id = builder().makeRuntimeArray(type_id);
			storage = spv::StorageClassUniformConstant;
			break;

		case DXIL::ResourceType::CBV:
		{
			RawType raw_type = raw_component_type_to_type(info.component);
			unsigned bits = raw_component_type_to_bits(info.component);

			unsigned vecsize = raw_vecsize_to_vecsize(info.raw_vecsize);
			type_id = raw_type == RawType::Float ? builder().makeFloatType(bits) : builder().makeUintType(bits);
			if (vecsize > 1)
				type_id = builder().makeVectorType(type_id, vecsize);

			unsigned element_size = (bits / 8) * vecsize;
			unsigned num_elements = 0x10000 / element_size;

			type_id = builder().makeArrayType(type_id, builder().makeUintConstant(num_elements), element_size);
			builder().addDecoration(type_id, spv::DecorationArrayStride, element_size);
			type_id = get_struct_type({ type_id }, 0, "BindlessCBV");
			builder().addDecoration(type_id, spv::DecorationBlock);
			if (options.bindless_cbv_ssbo_emulation)
				builder().addMemberDecoration(type_id, 0, spv::DecorationNonWritable);
			builder().addMemberDecoration(type_id, 0, spv::DecorationOffset, 0);
			type_id = builder().makeRuntimeArray(type_id);
			storage = options.bindless_cbv_ssbo_emulation ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;

			if (bits == 16)
			{
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer16BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer16BitAccess);
			}
			else if (bits == 8)
			{
				builder().addExtension("SPV_KHR_8bit_storage");
				if (options.bindless_cbv_ssbo_emulation)
					builder().addCapability(spv::CapabilityStorageBuffer8BitAccess);
				else
					builder().addCapability(spv::CapabilityUniformAndStorageBuffer8BitAccess);
			}
			break;
		}

		default:
			return 0;
		}

		builder().addExtension("SPV_EXT_descriptor_indexing");
		builder().addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
		resource.var_id = create_variable(storage, type_id);

		auto &meta = handle_to_resource_meta[resource.var_id];
		meta = {};
		meta.kind = info.kind;
		meta.component_type = info.component;
		meta.raw_component_vecsize = info.raw_vecsize;
		meta.var_id = resource.var_id;
		meta.storage = storage;

		builder().addDecoration(resource.var_id, spv::DecorationDescriptorSet, info.desc_set);
		builder().addDecoration(resource.var_id, spv::DecorationBinding, info.binding);

		if (info.relaxed_precision)
		{
			builder().addDecoration(resource.var_id, spv::DecorationRelaxedPrecision);

			// Signal the intended component type.
			switch (meta.component_type)
			{
			case DXIL::ComponentType::F32:
				meta.component_type = DXIL::ComponentType::F16;
				break;

			case DXIL::ComponentType::I32:
				meta.component_type = DXIL::ComponentType::I16;
				break;

			case DXIL::ComponentType::U32:
				meta.component_type = DXIL::ComponentType::U16;
				break;

			default:
				break;
			}
		}

		if (info.type == DXIL::ResourceType::UAV && !info.counters)
		{
			if (!info.uav_read)
				builder().addDecoration(resource.var_id, spv::DecorationNonReadable);
			if (!info.uav_written)
				builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			if (info.uav_coherent)
				builder().addDecoration(resource.var_id, spv::DecorationCoherent);
		}
		else if (info.counters)
		{
			builder().addDecoration(resource.var_id, spv::DecorationAliasedPointer);
		}
		else if (info.type == DXIL::ResourceType::SRV && info.descriptor_type == VulkanDescriptorType::SSBO)
		{
			builder().addDecoration(resource.var_id, spv::DecorationNonWritable);
			builder().addDecoration(resource.var_id, spv::DecorationRestrict);
		}

		// The default in Vulkan environment is Restrict.
		if (info.aliased && info.type == DXIL::ResourceType::UAV)
			builder().addDecoration(resource.var_id, spv::DecorationAliased);

		bindless_resources.push_back(resource);
		return resource.var_id;
	}
}